

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_twoDifferentOutputParametersInSameFunctionCallSucceeds_TestShell::
~TEST_MockParameterTest_twoDifferentOutputParametersInSameFunctionCallSucceeds_TestShell
          (TEST_MockParameterTest_twoDifferentOutputParametersInSameFunctionCallSucceeds_TestShell
           *this)

{
  TEST_MockParameterTest_twoDifferentOutputParametersInSameFunctionCallSucceeds_TestShell
  *this_local;
  
  ~TEST_MockParameterTest_twoDifferentOutputParametersInSameFunctionCallSucceeds_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockParameterTest, twoDifferentOutputParametersInSameFunctionCallSucceeds)
{
    int param1 = 1;
    int param2 = 1;
    int retval1 = 2;
    int retval2 = 3;

    mock().expectOneCall("foo")
        .withOutputParameterReturning("bar", &retval1, sizeof(retval1))
        .withOutputParameterReturning("foobar", &retval2, sizeof(retval2));
    mock().actualCall("foo")
        .withOutputParameter("bar", &param1)
        .withOutputParameter("foobar", &param2);

    CHECK_EQUAL(2, retval1);
    CHECK_EQUAL(2, param1);
    CHECK_EQUAL(3, retval2);
    CHECK_EQUAL(3, param2);
    mock().checkExpectations();
}